

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void ws_handshake(mg_connection *nc,mg_str *key)

{
  size_t sVar1;
  undefined1 local_134 [8];
  cs_sha1_ctx sha_ctx;
  char b64_sha [40];
  uchar local_a8 [8];
  char sha [20];
  uchar local_88 [8];
  char buf [100];
  mg_str *key_local;
  mg_connection *nc_local;
  
  snprintf((char *)local_88,100,"%.*s%s",key->len & 0xffffffff,key->p,ws_handshake::magic);
  cs_sha1_init((cs_sha1_ctx *)local_134);
  sVar1 = strlen((char *)local_88);
  cs_sha1_update((cs_sha1_ctx *)local_134,local_88,(uint32_t)sVar1);
  cs_sha1_final(local_a8,(cs_sha1_ctx *)local_134);
  mg_base64_encode(local_a8,0x14,(char *)(sha_ctx.buffer + 0x38));
  mg_printf(nc,"%s%s%s",
            "HTTP/1.1 101 Switching Protocols\r\nUpgrade: websocket\r\nConnection: Upgrade\r\nSec-WebSocket-Accept: "
            ,sha_ctx.buffer + 0x38,"\r\n\r\n");
  return;
}

Assistant:

static void ws_handshake(struct mg_connection *nc, const struct mg_str *key) {
    static const char *magic = "258EAFA5-E914-47DA-95CA-C5AB0DC85B11";
    char buf[MG_VPRINTF_BUFFER_SIZE], sha[20], b64_sha[sizeof(sha) * 2];
    cs_sha1_ctx sha_ctx;

    snprintf(buf, sizeof(buf), "%.*s%s", (int) key->len, key->p, magic);

    cs_sha1_init(&sha_ctx);
    cs_sha1_update(&sha_ctx, (unsigned char *) buf, strlen(buf));
    cs_sha1_final((unsigned char *) sha, &sha_ctx);

    mg_base64_encode((unsigned char *) sha, sizeof(sha), b64_sha);
    mg_printf(nc, "%s%s%s",
              "HTTP/1.1 101 Switching Protocols\r\n"
                      "Upgrade: websocket\r\n"
                      "Connection: Upgrade\r\n"
                      "Sec-WebSocket-Accept: ",
              b64_sha, "\r\n\r\n");
}